

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

string * __thiscall
yactfr::internal::BeginReadScopeInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,BeginReadScopeInstr *this,Size indent)

{
  ostream *poVar1;
  Scope scope;
  string rName;
  ostringstream ss;
  allocator local_25a;
  allocator local_259;
  string local_258;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198," ");
  std::__cxx11::string::string((string *)&local_1b8,"scope",&local_259);
  _strProp(&local_258,&local_1b8);
  poVar1 = std::operator<<(poVar1,(string *)&local_258);
  (anonymous_namespace)::scopeStr_abi_cxx11_
            (&local_1d8,(_anonymous_namespace_ *)(ulong)*(uint *)&(this->super_Instr).field_0xc,
             scope);
  local_238 = local_228;
  local_230 = 0;
  local_228[0] = 0;
  std::__cxx11::string::assign((char *)&local_238);
  std::__cxx11::string::append((string *)&local_238);
  std::__cxx11::string::append((char *)&local_238);
  poVar1 = std::operator<<(poVar1,(string *)&local_238);
  poVar1 = std::operator<<(poVar1," ");
  std::__cxx11::string::string((string *)&local_218,"align",&local_25a);
  _strProp(&local_1f8,&local_218);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_1b8);
  Proc::toStr_abi_cxx11_(&local_258,&this->_proc,indent + 1);
  std::operator<<((ostream *)local_198,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string BeginReadScopeInstr::_toStr(const Size indent) const
{
    std::ostringstream ss;

    ss << " " << _strProp("scope") << _strScopeName(scopeStr(_scope)) <<
          " " << _strProp("align") << _align << std::endl;
    ss << _proc.toStr(indent + 1);
    return ss.str();
}